

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeQueue.h
# Opt level: O0

void __thiscall
NotLockFreeQueue<std::packaged_task<void_()>_>::pop_and_wait
          (NotLockFreeQueue<std::packaged_task<void_()>_> *this,packaged_task<void_()> *item)

{
  anon_class_8_1_8991fb9c __p;
  undefined1 uVar1;
  unique_lock<std::mutex> *this_00;
  condition_variable *in_RDI;
  unique_lock<std::mutex> m;
  mutex_type *in_stack_ffffffffffffffa8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc0;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  uVar1 = std::
          queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
          ::empty((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
                   *)0x10bdb0);
  if ((bool)uVar1) {
    __p.this._7_1_ = (bool)uVar1;
    __p.this._0_7_ = in_stack_ffffffffffffffc0;
    std::condition_variable::
    wait<NotLockFreeQueue<std::packaged_task<void()>>::pop_and_wait(std::packaged_task<void()>&)::_lambda()_1_>
              (in_RDI,in_stack_ffffffffffffffb0,__p);
  }
  this_00 = (unique_lock<std::mutex> *)
            std::
            queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
            ::front((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
                     *)0x10be08);
  std::packaged_task<void_()>::operator=
            ((packaged_task<void_()> *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
             (packaged_task<void_()> *)in_RDI);
  std::
  queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
  ::pop((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
         *)0x10be28);
  std::unique_lock<std::mutex>::unlock(this_00);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(this_00);
  return;
}

Assistant:

void NotLockFreeQueue<T>::pop_and_wait(T& item) {
    std::unique_lock<std::mutex> m(mutex);
    if (queue.empty()) {
        cond_var_pop.wait(m, [this]{return !queue.empty();});
    }
    item = std::move(queue.front());
    queue.pop();
    m.unlock();
    cond_var_push.notify_one();
}